

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Status.cxx
# Opt level: O0

string * __thiscall adios2sys::Status::GetString_abi_cxx11_(Status *this)

{
  char *pcVar1;
  int *in_RSI;
  string *in_RDI;
  string *err;
  
  std::__cxx11::string::string((string *)in_RDI);
  if (*in_RSI == 0) {
    std::__cxx11::string::operator=((string *)in_RDI,"Success");
  }
  else if (*in_RSI == 1) {
    pcVar1 = strerror(in_RSI[1]);
    std::__cxx11::string::operator=((string *)in_RDI,pcVar1);
  }
  return in_RDI;
}

Assistant:

std::string Status::GetString() const
{
  std::string err;
  switch (this->Kind_) {
    case Kind::Success:
      err = "Success";
      break;
    case Kind::POSIX:
      err = strerror(this->POSIX_);
      break;
#ifdef _WIN32
    case Kind::Windows: {
      LPSTR message = NULL;
      DWORD size = FormatMessageA(
        FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM |
          FORMAT_MESSAGE_IGNORE_INSERTS,
        NULL, this->Windows_, MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
        (LPSTR)&message, 0, NULL);
      err = std::string(message, size);
      LocalFree(message);
    } break;
#endif
  }
  return err;
}